

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iso8601.c
# Opt level: O0

void test_date(char *str,int64_t millis)

{
  size_t sVar1;
  ulong uVar2;
  undefined1 local_220 [8];
  bson_error_t error;
  int64_t v;
  int64_t millis_local;
  char *str_local;
  
  sVar1 = strlen(str);
  uVar2 = _bson_iso8601_date_parse(str,sVar1 & 0xffffffff,error.message + 0x1f0,local_220);
  if ((uVar2 & 1) == 0) {
    fprintf(_stderr,"could not parse (%s)\n",str);
    abort();
  }
  if (error.message._496_8_ != millis) {
    fprintf(_stderr,"parsed value not correct: %ld != %ld\n",millis,error.message._496_8_);
    fprintf(_stderr,"parsing: [%s]\n",str);
    abort();
  }
  return;
}

Assistant:

static void
test_date (const char *str, int64_t millis)
{
   int64_t v;
   bson_error_t error;

   if (!_bson_iso8601_date_parse (str, strlen (str), &v, &error)) {
      fprintf (stderr, "could not parse (%s)\n", str);
      abort ();
   }

   if (v != millis) {
      fprintf (stderr,
               "parsed value not correct: %" PRId64 " != %" PRId64 "\n",
               millis,
               v);

      fprintf (stderr, "parsing: [%s]\n", str);
      abort ();
   }
}